

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_nextInputType_e ZSTD_nextInputType(ZSTD_DCtx *dctx)

{
  ZSTD_DCtx *dctx_local;
  
  switch(dctx->stage) {
  case ZSTDds_getFrameHeaderSize:
  case ZSTDds_decodeFrameHeader:
    dctx_local._4_4_ = ZSTDnit_frameHeader;
    break;
  case ZSTDds_decodeBlockHeader:
    dctx_local._4_4_ = ZSTDnit_blockHeader;
    break;
  case ZSTDds_decompressBlock:
    dctx_local._4_4_ = ZSTDnit_block;
    break;
  case ZSTDds_decompressLastBlock:
    dctx_local._4_4_ = ZSTDnit_lastBlock;
    break;
  case ZSTDds_checkChecksum:
    dctx_local._4_4_ = ZSTDnit_checksum;
    break;
  case ZSTDds_decodeSkippableHeader:
  case ZSTDds_skipFrame:
    dctx_local._4_4_ = ZSTDnit_skippableFrame;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5cff,"ZSTD_nextInputType_e ZSTD_nextInputType(ZSTD_DCtx *)");
  }
  return dctx_local._4_4_;
}

Assistant:

ZSTD_nextInputType_e ZSTD_nextInputType(ZSTD_DCtx* dctx) {
    switch(dctx->stage)
    {
    default:   /* should not happen */
        assert(0);
    case ZSTDds_getFrameHeaderSize:
    case ZSTDds_decodeFrameHeader:
        return ZSTDnit_frameHeader;
    case ZSTDds_decodeBlockHeader:
        return ZSTDnit_blockHeader;
    case ZSTDds_decompressBlock:
        return ZSTDnit_block;
    case ZSTDds_decompressLastBlock:
        return ZSTDnit_lastBlock;
    case ZSTDds_checkChecksum:
        return ZSTDnit_checksum;
    case ZSTDds_decodeSkippableHeader:
    case ZSTDds_skipFrame:
        return ZSTDnit_skippableFrame;
    }
}